

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_arithmetic.c
# Opt level: O3

mask_t gf_25519_isr(gf_25519_s *a,gf_25519_s *x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t y;
  uint uVar7;
  mask_t mVar8;
  mask_t mVar9;
  mask_t mVar10;
  ulong uVar11;
  int iVar12;
  uchar *bFalse;
  uchar *bTrue;
  bool bVar13;
  gf_25519_t L2;
  gf_25519_t L0;
  gf_25519_t tmp;
  gf_25519_t L1;
  gf_25519_t L3;
  gf_25519_s local_1a0;
  gf_25519_s local_160;
  gf_25519_s local_120;
  gf_25519_s local_e0;
  gf_25519_s local_a0;
  
  gf_25519_sqr(&local_160,x);
  gf_25519_mul(&local_e0,&local_160,x);
  gf_25519_sqr(&local_160,&local_e0);
  gf_25519_mul(&local_e0,&local_160,x);
  gf_25519_sqr(&local_160,&local_e0);
  gf_25519_sqr(&local_120,&local_160);
  gf_25519_sqr(&local_160,&local_120);
  gf_25519_mul(&local_1a0,&local_160,&local_e0);
  gf_25519_sqr(&local_120,&local_1a0);
  gf_25519_sqr(&local_160,&local_120);
  iVar12 = -4;
  do {
    gf_25519_sqr(&local_120,&local_160);
    gf_25519_sqr(&local_160,&local_120);
    iVar12 = iVar12 + 2;
  } while (iVar12 != 0);
  gf_25519_mul(&local_e0,&local_1a0,&local_160);
  gf_25519_sqr(&local_1a0,&local_e0);
  gf_25519_mul(&local_160,&local_1a0,x);
  gf_25519_sqr(&local_120,&local_160);
  gf_25519_sqr(&local_1a0,&local_120);
  iVar12 = -10;
  do {
    gf_25519_sqr(&local_120,&local_1a0);
    gf_25519_sqr(&local_1a0,&local_120);
    iVar12 = iVar12 + 2;
  } while (iVar12 != 0);
  gf_25519_mul(&local_160,&local_1a0,&local_e0);
  gf_25519_sqr(&local_1a0,&local_160);
  iVar12 = -0x18;
  do {
    gf_25519_sqr(&local_120,&local_1a0);
    gf_25519_sqr(&local_1a0,&local_120);
    iVar12 = iVar12 + 2;
  } while (iVar12 != 0);
  gf_25519_mul(&local_a0,&local_1a0,&local_160);
  gf_25519_sqr(&local_1a0,&local_a0);
  iVar12 = -0x18;
  do {
    gf_25519_sqr(&local_120,&local_1a0);
    gf_25519_sqr(&local_1a0,&local_120);
    iVar12 = iVar12 + 2;
  } while (iVar12 != 0);
  gf_25519_mul(&local_e0,&local_1a0,&local_160);
  gf_25519_sqr(&local_120,&local_e0);
  gf_25519_sqr(&local_1a0,&local_120);
  iVar12 = -0x30;
  do {
    gf_25519_sqr(&local_120,&local_1a0);
    gf_25519_sqr(&local_1a0,&local_120);
    iVar12 = iVar12 + 2;
  } while (iVar12 != 0);
  gf_25519_mul(&local_160,&local_1a0,&local_a0);
  gf_25519_sqr(&local_1a0,&local_160);
  iVar12 = -0x7c;
  do {
    gf_25519_sqr(&local_120,&local_1a0);
    gf_25519_sqr(&local_1a0,&local_120);
    iVar12 = iVar12 + 2;
  } while (iVar12 != 0);
  gf_25519_mul(&local_a0,&local_1a0,&local_160);
  gf_25519_sqr(&local_120,&local_a0);
  gf_25519_sqr(&local_1a0,&local_120);
  gf_25519_mul(&local_160,&local_1a0,x);
  gf_25519_sqr(&local_1a0,&local_160);
  gf_25519_mul(&local_a0,&local_1a0,x);
  gf_25519_add(&local_e0,&local_a0,gf_25519_ONE);
  mVar8 = gf_25519_eq(&local_a0,gf_25519_ONE);
  mVar9 = gf_25519_eq(&local_e0,gf_25519_ZERO);
  mVar10 = gf_25519_eq(&local_a0,P25519_SQRT_MINUS_ONE);
  uVar7 = (uint)mVar10 | (uint)mVar8;
  uVar11 = 0;
  do {
    uVar4 = *(uint *)((long)gf_25519_ONE[0].limb + uVar11 + 4);
    uVar5 = *(uint *)((long)gf_25519_ONE[0].limb + uVar11 + 8);
    uVar6 = *(uint *)((long)gf_25519_ONE[0].limb + uVar11 + 0xc);
    uVar1 = *(uint *)((long)P25519_SQRT_MINUS_ONE[0].limb + uVar11 + 4);
    uVar2 = *(uint *)((long)P25519_SQRT_MINUS_ONE[0].limb + uVar11 + 8);
    uVar3 = *(uint *)((long)P25519_SQRT_MINUS_ONE[0].limb + uVar11 + 0xc);
    *(uint *)((long)local_1a0.limb + uVar11) =
         *(uint *)((long)P25519_SQRT_MINUS_ONE[0].limb + uVar11) & (uVar7 ^ 0xffffffff) |
         *(uint *)((long)gf_25519_ONE[0].limb + uVar11) & uVar7;
    *(uint *)((long)local_1a0.limb + uVar11 + 4) = uVar1 & (uVar7 ^ 0xffffffff) | uVar4 & uVar7;
    *(uint *)((long)local_1a0.limb + uVar11 + 8) = uVar2 & (uVar7 ^ 0xffffffff) | uVar5 & uVar7;
    *(uint *)((long)local_1a0.limb + uVar11 + 0xc) = uVar3 & (uVar7 ^ 0xffffffff) | uVar6 & uVar7;
    bVar13 = uVar11 < 0x21;
    uVar11 = uVar11 + 0x10;
  } while (bVar13);
  gf_25519_mul(a,&local_1a0,&local_160);
  return mVar9 | mVar8;
}

Assistant:

mask_t gf_isr (gf a, const gf x) {
    gf L0, L1, L2, L3;
    
    gf_sqr (L0, x);
    gf_mul (L1, L0, x);
    gf_sqr (L0, L1);
    gf_mul (L1, L0, x);
    gf_sqrn(L0, L1, 3);
    gf_mul (L2, L0, L1);
    gf_sqrn(L0, L2, 6);
    gf_mul (L1, L2, L0);
    gf_sqr (L2, L1);
    gf_mul (L0, L2, x);
    gf_sqrn(L2, L0, 12);
    gf_mul (L0, L2, L1);
    gf_sqrn(L2, L0, 25);
    gf_mul (L3, L2, L0);
    gf_sqrn(L2, L3, 25);
    gf_mul (L1, L2, L0);    
    gf_sqrn(L2, L1, 50);
    gf_mul (L0, L2, L3);
    gf_sqrn(L2, L0, 125);
    gf_mul (L3, L2, L0);
    gf_sqrn(L2, L3, 2);
    gf_mul (L0, L2, x);

    gf_sqr (L2, L0);
    gf_mul (L3, L2, x);
    gf_add(L1,L3,ONE);
    mask_t one = gf_eq(L3,ONE);
    mask_t succ = one | gf_eq(L1,ZERO);
    mask_t qr   = one | gf_eq(L3,SQRT_MINUS_ONE);
    
    constant_time_select(L2, SQRT_MINUS_ONE, ONE, sizeof(L2), qr, 0);
    gf_mul (a,L2,L0);
    return succ;
}